

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O1

void __thiscall
cbtDbvt::collideTTpersistentStack
          (cbtDbvt *this,cbtDbvtNode *root0,cbtDbvtNode *root1,ICollide *policy)

{
  int iVar1;
  sStkNN *psVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtNode *pcVar4;
  cbtDbvtNode *pcVar5;
  sStkNN *psVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (root1 != (cbtDbvtNode *)0x0 && root0 != (cbtDbvtNode *)0x0) {
    if (((this->m_stkStack).m_size < 0x80) && ((this->m_stkStack).m_capacity < 0x80)) {
      psVar6 = (sStkNN *)cbtAlignedAllocInternal(0x800,0x10);
      lVar7 = (long)(this->m_stkStack).m_size;
      if (0 < lVar7) {
        lVar9 = 0;
        do {
          *(undefined1 (*) [16])((long)&psVar6->a + lVar9) =
               *(undefined1 (*) [16])((long)&((this->m_stkStack).m_data)->a + lVar9);
          lVar9 = lVar9 + 0x10;
        } while (lVar7 * 0x10 != lVar9);
      }
      psVar2 = (this->m_stkStack).m_data;
      if (psVar2 != (sStkNN *)0x0) {
        if ((this->m_stkStack).m_ownsMemory == true) {
          cbtAlignedFreeInternal(psVar2);
        }
        (this->m_stkStack).m_data = (sStkNN *)0x0;
      }
      (this->m_stkStack).m_ownsMemory = true;
      (this->m_stkStack).m_data = psVar6;
      (this->m_stkStack).m_capacity = 0x80;
    }
    (this->m_stkStack).m_size = 0x80;
    psVar6 = (this->m_stkStack).m_data;
    psVar6->a = root0;
    psVar6->b = root1;
    iVar11 = 1;
    iVar13 = 0x7c;
    do {
      lVar9 = (long)iVar11;
      iVar12 = iVar11 + -1;
      lVar7 = lVar9 + -1;
      psVar6 = (this->m_stkStack).m_data;
      pcVar3 = psVar6[lVar7].a;
      pcVar4 = psVar6[lVar7].b;
      if (iVar13 < iVar12) {
        iVar1 = (this->m_stkStack).m_size;
        iVar13 = iVar1 * 2;
        if ((iVar1 < iVar13) && ((this->m_stkStack).m_capacity < iVar13)) {
          if (iVar1 == 0) {
            psVar6 = (sStkNN *)0x0;
          }
          else {
            psVar6 = (sStkNN *)cbtAlignedAllocInternal((long)iVar1 << 5,0x10);
          }
          lVar8 = (long)(this->m_stkStack).m_size;
          if (0 < lVar8) {
            lVar10 = 0;
            do {
              *(undefined1 (*) [16])((long)&psVar6->a + lVar10) =
                   *(undefined1 (*) [16])((long)&((this->m_stkStack).m_data)->a + lVar10);
              lVar10 = lVar10 + 0x10;
            } while (lVar8 * 0x10 != lVar10);
          }
          psVar2 = (this->m_stkStack).m_data;
          if (psVar2 != (sStkNN *)0x0) {
            if ((this->m_stkStack).m_ownsMemory == true) {
              cbtAlignedFreeInternal(psVar2);
            }
            (this->m_stkStack).m_data = (sStkNN *)0x0;
          }
          (this->m_stkStack).m_ownsMemory = true;
          (this->m_stkStack).m_data = psVar6;
          (this->m_stkStack).m_capacity = iVar13;
        }
        (this->m_stkStack).m_size = iVar13;
        iVar13 = iVar13 + -4;
      }
      if (pcVar3 == pcVar4) {
        if ((pcVar3->field_2).childs[1] != (cbtDbvtNode *)0x0) {
          pcVar4 = (pcVar3->field_2).childs[0];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar7].a = pcVar4;
          psVar6[lVar7].b = pcVar4;
          pcVar4 = (pcVar3->field_2).childs[1];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar9].a = pcVar4;
          psVar6[lVar9].b = pcVar4;
          *(anon_union_16_3_f0e812c0_for_cbtDbvtNode_2 *)((this->m_stkStack).m_data + lVar9 + 1) =
               pcVar3->field_2;
          iVar12 = iVar11 + 2;
        }
      }
      else if (((((pcVar3->volume).mi.m_floats[0] <= (pcVar4->volume).mx.m_floats[0]) &&
                ((pcVar4->volume).mi.m_floats[0] <= (pcVar3->volume).mx.m_floats[0])) &&
               ((pcVar3->volume).mi.m_floats[1] <= (pcVar4->volume).mx.m_floats[1])) &&
              ((((pcVar4->volume).mi.m_floats[1] <= (pcVar3->volume).mx.m_floats[1] &&
                ((pcVar3->volume).mi.m_floats[2] <= (pcVar4->volume).mx.m_floats[2])) &&
               ((pcVar4->volume).mi.m_floats[2] <= (pcVar3->volume).mx.m_floats[2])))) {
        if ((pcVar3->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          if ((pcVar4->field_2).childs[1] == (cbtDbvtNode *)0x0) {
            (*policy->_vptr_ICollide[2])(policy,pcVar3);
          }
          else {
            pcVar5 = (pcVar4->field_2).childs[0];
            psVar6 = (this->m_stkStack).m_data;
            psVar6[lVar7].a = pcVar3;
            psVar6[lVar7].b = pcVar5;
            pcVar4 = (pcVar4->field_2).childs[1];
            psVar6 = (this->m_stkStack).m_data;
            psVar6[lVar9].a = pcVar3;
            psVar6[lVar9].b = pcVar4;
            iVar12 = iVar11 + 1;
          }
        }
        else if ((pcVar4->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar7].a = (pcVar3->field_2).childs[0];
          psVar6[lVar7].b = pcVar4;
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar9].a = (pcVar3->field_2).childs[1];
          psVar6[lVar9].b = pcVar4;
          iVar12 = iVar11 + 1;
        }
        else {
          pcVar5 = (pcVar4->field_2).childs[0];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar7].a = (pcVar3->field_2).childs[0];
          psVar6[lVar7].b = pcVar5;
          pcVar5 = (pcVar4->field_2).childs[0];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar9].a = (pcVar3->field_2).childs[1];
          psVar6[lVar9].b = pcVar5;
          pcVar5 = (pcVar4->field_2).childs[1];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar9 + 1].a = (pcVar3->field_2).childs[0];
          psVar6[lVar9 + 1].b = pcVar5;
          pcVar4 = (pcVar4->field_2).childs[1];
          psVar6 = (this->m_stkStack).m_data;
          psVar6[lVar9 + 2].a = (pcVar3->field_2).childs[1];
          psVar6[lVar9 + 2].b = pcVar4;
          iVar12 = iVar11 + 3;
        }
      }
      iVar11 = iVar12;
    } while (iVar11 != 0);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTTpersistentStack(const cbtDbvtNode* root0,
											 const cbtDbvtNode* root1,
											 DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
	if (root0 && root1)
	{
		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 4;

		m_stkStack.resize(DOUBLE_STACKSIZE);
		m_stkStack[0] = sStkNN(root0, root1);
		do
		{
			sStkNN p = m_stkStack[--depth];
			if (depth > treshold)
			{
				m_stkStack.resize(m_stkStack.size() * 2);
				treshold = m_stkStack.size() - 4;
			}
			if (p.a == p.b)
			{
				if (p.a->isinternal())
				{
					m_stkStack[depth++] = sStkNN(p.a->childs[0], p.a->childs[0]);
					m_stkStack[depth++] = sStkNN(p.a->childs[1], p.a->childs[1]);
					m_stkStack[depth++] = sStkNN(p.a->childs[0], p.a->childs[1]);
				}
			}
			else if (Intersect(p.a->volume, p.b->volume))
			{
				if (p.a->isinternal())
				{
					if (p.b->isinternal())
					{
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b->childs[1]);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b->childs[1]);
					}
					else
					{
						m_stkStack[depth++] = sStkNN(p.a->childs[0], p.b);
						m_stkStack[depth++] = sStkNN(p.a->childs[1], p.b);
					}
				}
				else
				{
					if (p.b->isinternal())
					{
						m_stkStack[depth++] = sStkNN(p.a, p.b->childs[0]);
						m_stkStack[depth++] = sStkNN(p.a, p.b->childs[1]);
					}
					else
					{
						policy.Process(p.a, p.b);
					}
				}
			}
		} while (depth);
	}
}